

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

void MARGINAL::predict_or_learn<false>(data *sm,single_learner *base,example *ec)

{
  example *in_RDX;
  learner<char,_example> *in_RSI;
  data *in_RDI;
  example *in_stack_00000008;
  float pred;
  example *in_stack_00000148;
  data *in_stack_00000150;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  make_marginal<false>(in_stack_00000150,in_stack_00000148);
  LEARNER::learner<char,_example>::predict
            (in_RSI,in_RDX,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if ((in_RDI->compete & 1U) != 0) {
    in_RDI->feature_pred = (in_RDX->pred).scalar;
    compute_expert_loss<false>(in_RDI,in_RDX);
  }
  undo_marginal((data *)ec,in_stack_00000008);
  return;
}

Assistant:

void predict_or_learn(data& sm, LEARNER::single_learner& base, example& ec)
{
  make_marginal<is_learn>(sm, ec);
  if (is_learn)
    if (sm.update_before_learn)
    {
      base.predict(ec);
      float pred = ec.pred.scalar;
      if (sm.compete)
      {
        sm.feature_pred = pred;
        compute_expert_loss<is_learn>(sm, ec);
      }
      undo_marginal(sm, ec);
      update_marginal(sm, ec);  // update features before learning.
      make_marginal<is_learn>(sm, ec);
      base.learn(ec);
      ec.pred.scalar = pred;
    }
    else
    {
      base.learn(ec);
      if (sm.compete)
      {
        sm.feature_pred = ec.pred.scalar;
        compute_expert_loss<is_learn>(sm, ec);
      }
      update_marginal(sm, ec);
    }
  else
  {
    base.predict(ec);
    float pred = ec.pred.scalar;
    if (sm.compete)
    {
      sm.feature_pred = pred;
      compute_expert_loss<is_learn>(sm, ec);
    }
  }

  // undo marginalization
  undo_marginal(sm, ec);
}